

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O2

void av1_build_nmv_component_cost_table
               (int *mvcost,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  uint uVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int hp;
  long lVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  aom_cdf_prob (*cdf) [3];
  aom_cdf_prob (*cdf_00) [5];
  int *piVar14;
  int *local_158;
  long local_150;
  int hp_cost [2];
  int class0_hp_cost [2];
  int sign_cost [2];
  int class0_cost [2];
  int cost_swap [10];
  int fp_cost [4];
  int class_cost [11];
  int class0_fp_cost [2] [4];
  int bits_cost [10] [2];
  
  class0_fp_cost[1][0] = 0;
  class0_fp_cost[1][1] = 0;
  class0_fp_cost[1][2] = 0;
  class0_fp_cost[1][3] = 0;
  class0_fp_cost[0][0] = 0;
  class0_fp_cost[0][1] = 0;
  class0_fp_cost[0][2] = 0;
  class0_fp_cost[0][3] = 0;
  fp_cost[0] = 0;
  fp_cost[1] = 0;
  fp_cost[2] = 0;
  fp_cost[3] = 0;
  class0_hp_cost[0] = 0;
  class0_hp_cost[1] = 0;
  hp_cost[0] = 0;
  hp_cost[1] = 0;
  av1_cost_tokens_from_cdf(sign_cost,mvcomp->sign_cdf,(int *)0x0);
  av1_cost_tokens_from_cdf(class_cost,mvcomp->classes_cdf,(int *)0x0);
  av1_cost_tokens_from_cdf(class0_cost,mvcomp->class0_cdf,(int *)0x0);
  cdf = mvcomp->bits_cdf;
  for (lVar13 = 0; lVar13 != 0x50; lVar13 = lVar13 + 8) {
    av1_cost_tokens_from_cdf((int *)((long)bits_cost[0] + lVar13),*cdf,(int *)0x0);
    cdf = cdf + 1;
  }
  if (-1 < precision) {
    cdf_00 = mvcomp->class0_fp_cdf;
    for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 0x10) {
      av1_cost_tokens_from_cdf((int *)((long)class0_fp_cost[0] + lVar13),*cdf_00,(int *)0x0);
      cdf_00 = cdf_00 + 1;
    }
    av1_cost_tokens_from_cdf(fp_cost,mvcomp->fp_cdf,(int *)0x0);
    if (precision != '\0') {
      av1_cost_tokens_from_cdf(class0_hp_cost,mvcomp->class0_hp_cdf,(int *)0x0);
      av1_cost_tokens_from_cdf(hp_cost,mvcomp->hp_cdf,(int *)0x0);
    }
  }
  cost_swap[4] = 0;
  cost_swap[5] = 0;
  cost_swap[6] = 0;
  cost_swap[7] = 0;
  cost_swap[8] = 0;
  cost_swap[9] = 0;
  cost_swap[0] = 0;
  cost_swap[1] = 0;
  cost_swap[2] = 0;
  cost_swap[3] = 0;
  for (uVar2 = 1; uVar2 != 10; uVar2 = uVar2 + 1) {
    iVar6 = bits_cost[uVar2 - 1][1];
    cost_swap[uVar2] = iVar6;
    if (1 < uVar2) {
      cost_swap[uVar2] = iVar6 - fp_cost[uVar2 + 3];
    }
  }
  local_158 = mvcost + 1;
  piVar3 = local_158;
  for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
    iVar6 = fp_cost[lVar13];
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      piVar3[lVar7] = hp_cost[lVar7] + iVar6 + sign_cost[0];
    }
    piVar3 = piVar3 + 2;
  }
  iVar6 = sign_cost[1] - sign_cost[0];
  *mvcost = 0;
  local_150 = 1;
  for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 1) {
    uVar1 = 8 << ((byte)lVar13 & 0x1f);
    if (lVar13 == 0) {
      iVar9 = 0;
    }
    else {
      iVar9 = class_cost[lVar13];
    }
    iVar5 = bits_cost[lVar13][0];
    lVar11 = 0;
    for (lVar7 = 0; lVar7 != local_150; lVar7 = lVar7 + 1) {
      lVar8 = -((ulong)((int)lVar11 + uVar1) << 0x20);
      for (lVar11 = (long)(int)lVar11; lVar8 = lVar8 + -0x100000000,
          lVar11 < 8 << ((byte)lVar7 & 0x1f); lVar11 = lVar11 + 1) {
        iVar4 = mvcost[lVar11 + 1] + iVar9 + cost_swap[lVar7];
        mvcost[(ulong)uVar1 + lVar11 + 1] = iVar4;
        *(int *)((long)mvcost + (lVar8 >> 0x1e)) = iVar4 + iVar6;
      }
      cost_swap[lVar7] = cost_swap[lVar7] + iVar5;
    }
    local_150 = local_150 + 1;
  }
  iVar9 = 0;
  for (lVar13 = 0; lVar13 != 10; lVar13 = lVar13 + 1) {
    lVar11 = 0;
    for (lVar7 = (long)iVar9; lVar7 < (long)(ulong)(uint)(8 << ((byte)lVar13 & 0x1f));
        lVar7 = lVar7 + 1) {
      iVar5 = local_158[lVar7] + class_cost[10] + cost_swap[lVar13];
      mvcost[lVar7 + 0x2001] = iVar5;
      mvcost[(lVar11 + -0x2001) - (long)iVar9] = iVar5 + iVar6;
      lVar11 = lVar11 + -1;
    }
    iVar9 = iVar9 - (int)lVar11;
  }
  lVar13 = (long)iVar9;
  piVar3 = mvcost + (-0x2001 - lVar13);
  for (; lVar13 < 0x1fff; lVar13 = lVar13 + 1) {
    iVar9 = local_158[lVar13] + (bits_cost[9][1] - class_cost[9]) + class_cost[10];
    mvcost[lVar13 + 0x2001] = iVar9;
    *piVar3 = iVar9 + iVar6;
    piVar3 = piVar3 + -1;
  }
  piVar3 = mvcost + -1;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    iVar6 = class0_cost[lVar13];
    piVar10 = piVar3;
    piVar12 = local_158;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      iVar9 = class0_fp_cost[lVar13][lVar7];
      piVar14 = piVar10;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        iVar5 = class0_hp_cost[lVar11] + iVar9 + class_cost[0] + iVar6;
        piVar12[lVar11] = iVar5 + sign_cost[0];
        *piVar14 = iVar5 + sign_cost[1];
        piVar14 = piVar14 + -1;
      }
      piVar12 = piVar12 + 2;
      piVar10 = piVar10 + -2;
    }
    local_158 = local_158 + 8;
    piVar3 = piVar3 + -8;
  }
  return;
}

Assistant:

void av1_build_nmv_component_cost_table(int *mvcost,
                                        const nmv_component *const mvcomp,
                                        MvSubpelPrecision precision) {
  int i, j, v, o, mantissa;
  int sign_cost[2], class_cost[MV_CLASSES], class0_cost[CLASS0_SIZE];
  int bits_cost[MV_OFFSET_BITS][2];
  int class0_fp_cost[CLASS0_SIZE][MV_FP_SIZE] = { 0 },
      fp_cost[MV_FP_SIZE] = { 0 };
  int class0_hp_cost[2] = { 0 }, hp_cost[2] = { 0 };

  av1_cost_tokens_from_cdf(sign_cost, mvcomp->sign_cdf, NULL);
  av1_cost_tokens_from_cdf(class_cost, mvcomp->classes_cdf, NULL);
  av1_cost_tokens_from_cdf(class0_cost, mvcomp->class0_cdf, NULL);
  for (i = 0; i < MV_OFFSET_BITS; ++i) {
    av1_cost_tokens_from_cdf(bits_cost[i], mvcomp->bits_cdf[i], NULL);
  }

  if (precision > MV_SUBPEL_NONE) {
    for (i = 0; i < CLASS0_SIZE; ++i)
      av1_cost_tokens_from_cdf(class0_fp_cost[i], mvcomp->class0_fp_cdf[i],
                               NULL);
    av1_cost_tokens_from_cdf(fp_cost, mvcomp->fp_cdf, NULL);
  }

  if (precision > MV_SUBPEL_LOW_PRECISION) {
    av1_cost_tokens_from_cdf(class0_hp_cost, mvcomp->class0_hp_cdf, NULL);
    av1_cost_tokens_from_cdf(hp_cost, mvcomp->hp_cdf, NULL);
  }

  // Instead of accumulating the cost of each vector component's bits
  //   individually, compute the costs based on smaller vectors. Costs for
  //   [2^exp, 2 * 2^exp - 1] are calculated based on [0, 2^exp - 1]
  //   respectively. Offsets are maintained to swap both 1) class costs when
  //   treated as a complete vector component with the highest set bit when
  //   treated as a mantissa (significand) and 2) leading zeros to account for
  //   the current exponent.

  // Cost offsets
  int cost_swap[MV_OFFSET_BITS] = { 0 };
  // Delta to convert positive vector to negative vector costs
  int negate_sign = sign_cost[1] - sign_cost[0];

  // Initialize with offsets to swap the class costs with the costs of the
  //   highest set bit.
  for (i = 1; i < MV_OFFSET_BITS; ++i) {
    cost_swap[i] = bits_cost[i - 1][1];
    if (i > CLASS0_BITS) cost_swap[i] -= class_cost[i - CLASS0_BITS];
  }

  // Seed the fractional costs onto the output (overwritten latter).
  for (o = 0; o < MV_FP_SIZE; ++o) {
    int hp;
    for (hp = 0; hp < 2; ++hp) {
      v = 2 * o + hp + 1;
      mvcost[v] = fp_cost[o] + hp_cost[hp] + sign_cost[0];
    }
  }

  mvcost[0] = 0;
  // Fill the costs for each exponent's vectors, using the costs set in the
  //   previous exponents.
  for (i = 0; i < MV_OFFSET_BITS; ++i) {
    const int exponent = (2 * MV_FP_SIZE) << i;

    int class = 0;
    if (i >= CLASS0_BITS) {
      class = class_cost[i - CLASS0_BITS + 1];
    }

    // Iterate through mantissas, keeping track of the location
    //   of the highest set bit for the mantissa.
    // To be clear: in the outer loop, the position of the highest set bit
    //   (exponent) is tracked and, in this loop, the highest set bit of the
    //   mantissa is tracked.
    mantissa = 0;
    for (j = 0; j <= i; ++j) {
      for (; mantissa < (2 * MV_FP_SIZE) << j; ++mantissa) {
        int cost = mvcost[mantissa + 1] + class + cost_swap[j];
        v = exponent + mantissa + 1;
        mvcost[v] = cost;
        mvcost[-v] = cost + negate_sign;
      }
      cost_swap[j] += bits_cost[i][0];
    }
  }

  // Special case to avoid buffer overrun
  {
    int exponent = (2 * MV_FP_SIZE) << MV_OFFSET_BITS;
    int class = class_cost[MV_CLASSES - 1];
    mantissa = 0;
    for (j = 0; j < MV_OFFSET_BITS; ++j) {
      for (; mantissa < (2 * MV_FP_SIZE) << j; ++mantissa) {
        int cost = mvcost[mantissa + 1] + class + cost_swap[j];
        v = exponent + mantissa + 1;
        mvcost[v] = cost;
        mvcost[-v] = cost + negate_sign;
      }
    }
    // At this point: mantissa = exponent >> 1

    // Manually calculate the final cost offset
    int cost_swap_hi =
        bits_cost[MV_OFFSET_BITS - 1][1] - class_cost[MV_CLASSES - 2];
    for (; mantissa < exponent - 1; ++mantissa) {
      int cost = mvcost[mantissa + 1] + class + cost_swap_hi;
      v = exponent + mantissa + 1;
      mvcost[v] = cost;
      mvcost[-v] = cost + negate_sign;
    }
  }

  // Fill costs for class0 vectors, overwriting previous placeholder values
  //   used for calculating the costs of the larger vectors.
  for (i = 0; i < CLASS0_SIZE; ++i) {
    const int top = i * 2 * MV_FP_SIZE;
    for (o = 0; o < MV_FP_SIZE; ++o) {
      int hp;
      int cost = class0_fp_cost[i][o] + class_cost[0] + class0_cost[i];
      for (hp = 0; hp < 2; ++hp) {
        v = top + 2 * o + hp + 1;
        mvcost[v] = cost + class0_hp_cost[hp] + sign_cost[0];
        mvcost[-v] = cost + class0_hp_cost[hp] + sign_cost[1];
      }
    }
  }
}